

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS ref_node_add_core(REF_NODE ref_node,REF_GLOB global,REF_INT *node)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  REF_GLOB *pRVar4;
  REF_INT *pRVar5;
  REF_DBL *pRVar6;
  int iVar7;
  undefined8 uVar8;
  long *plVar9;
  ulong uVar10;
  long lVar11;
  char *pcVar12;
  
  if (global < 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x11f,
           "ref_node_add_core",3,"invalid global node");
    return 3;
  }
  if (ref_node->blank != -1) goto LAB_00190c95;
  iVar2 = ref_node->max;
  iVar7 = 5000;
  if (5000 < (int)((double)iVar2 * 1.5)) {
    iVar7 = (int)((double)iVar2 * 1.5);
  }
  ref_node->max = iVar7 + iVar2;
  fflush(_stdout);
  if (0 < (long)ref_node->max) {
    pRVar4 = (REF_GLOB *)realloc(ref_node->global,(long)ref_node->max << 3);
    ref_node->global = pRVar4;
  }
  pRVar4 = ref_node->global;
  if (pRVar4 == (REF_GLOB *)0x0) {
    pcVar12 = "realloc ref_node->global NULL";
    uVar8 = 0x125;
LAB_00190fc1:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar8,
           "ref_node_add_core",pcVar12);
    uVar10 = (ulong)ref_node->max;
LAB_00190fce:
    lVar11 = uVar10 * 8;
  }
  else {
    iVar7 = ref_node->max;
    if (iVar2 < iVar7) {
      plVar9 = pRVar4 + iVar2;
      lVar11 = -3 - (long)iVar2;
      do {
        *plVar9 = lVar11;
        plVar9 = plVar9 + 1;
        lVar1 = iVar7 + lVar11;
        lVar11 = lVar11 + -1;
      } while (lVar1 != -2);
    }
    pRVar4[(long)iVar7 + -1] = -1;
    ref_node->blank = -2 - iVar2;
    fflush(_stdout);
    if (0 < (long)ref_node->max) {
      pRVar4 = (REF_GLOB *)realloc(ref_node->sorted_global,(long)ref_node->max << 3);
      ref_node->sorted_global = pRVar4;
    }
    if (ref_node->sorted_global == (REF_GLOB *)0x0) {
      pcVar12 = "realloc ref_node->sorted_global NULL";
      uVar8 = 299;
      goto LAB_00190fc1;
    }
    fflush(_stdout);
    if (0 < (long)ref_node->max) {
      pRVar5 = (REF_INT *)realloc(ref_node->sorted_local,(long)ref_node->max << 2);
      ref_node->sorted_local = pRVar5;
    }
    if (ref_node->sorted_local == (REF_INT *)0x0) {
      pcVar12 = "realloc ref_node->sorted_local NULL";
      uVar8 = 300;
LAB_0019104e:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar8,
             "ref_node_add_core",pcVar12);
      uVar10 = (ulong)ref_node->max;
      lVar11 = uVar10 * 4;
      uVar8 = 4;
      goto LAB_0019106f;
    }
    fflush(_stdout);
    if (0 < (long)ref_node->max) {
      pRVar5 = (REF_INT *)realloc(ref_node->part,(long)ref_node->max << 2);
      ref_node->part = pRVar5;
    }
    if (ref_node->part == (REF_INT *)0x0) {
      pcVar12 = "realloc ref_node->part NULL";
      uVar8 = 0x12e;
      goto LAB_0019104e;
    }
    fflush(_stdout);
    if (0 < (long)ref_node->max) {
      pRVar5 = (REF_INT *)realloc(ref_node->age,(long)ref_node->max << 2);
      ref_node->age = pRVar5;
    }
    if (ref_node->age == (REF_INT *)0x0) {
      pcVar12 = "realloc ref_node->age NULL";
      uVar8 = 0x12f;
      goto LAB_0019104e;
    }
    fflush(_stdout);
    if ((long)ref_node->max != 0) {
      pRVar6 = (REF_DBL *)realloc(ref_node->real,(long)ref_node->max * 0x78);
      ref_node->real = pRVar6;
    }
    if (ref_node->real != (REF_DBL *)0x0) {
      if (ref_node->naux < 1) {
LAB_00190c95:
        iVar2 = -2 - ref_node->blank;
        *node = iVar2;
        ref_node->blank = (REF_INT)ref_node->global[iVar2];
        iVar2 = *node;
        ref_node->global[iVar2] = global;
        ref_node->part[iVar2] = ref_node->ref_mpi->id;
        ref_node->age[*node] = 0;
        uVar3 = ref_node_metric_form(ref_node,*node,1.0,0.0,0.0,1.0,0.0,1.0);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0x145,"ref_node_add_core",(ulong)uVar3,"set ident");
          return uVar3;
        }
        ref_node->n = ref_node->n + 1;
        return 0;
      }
      fflush(_stdout);
      lVar11 = (long)ref_node->max * (long)ref_node->naux;
      if (lVar11 != 0) {
        pRVar6 = (REF_DBL *)realloc(ref_node->aux,lVar11 * 8);
        ref_node->aux = pRVar6;
      }
      if (ref_node->aux != (REF_DBL *)0x0) goto LAB_00190c95;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x13a,
             "ref_node_add_core","realloc ref_node->aux NULL");
      uVar10 = (long)ref_node->max * (long)ref_node->naux;
      goto LAB_00190fce;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x134,
           "ref_node_add_core","realloc ref_node->real NULL");
    uVar10 = (long)ref_node->max * 0xf;
    lVar11 = (long)ref_node->max * 0x78;
  }
  uVar8 = 8;
LAB_0019106f:
  printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",uVar10 & 0xffffffff,uVar10,uVar8
         ,lVar11);
  return 2;
}

Assistant:

REF_FCN static REF_STATUS ref_node_add_core(REF_NODE ref_node, REF_GLOB global,
                                            REF_INT *node) {
  REF_INT orig, chunk, extra;

  if (global < 0) RSS(REF_INVALID, "invalid global node");

  if (REF_EMPTY == ref_node->blank) {
    orig = ref_node_max(ref_node);
    chunk = MAX(5000, (REF_INT)(1.5 * (REF_DBL)orig));
    ref_node->max = orig + chunk;
    ref_realloc(ref_node->global, ref_node_max(ref_node), REF_GLOB);
    for (extra = orig; extra < ref_node_max(ref_node); extra++)
      ref_node->global[extra] = index2next(extra + 1);
    ref_node->global[ref_node_max(ref_node) - 1] = REF_EMPTY;
    ref_node->blank = index2next(orig);

    ref_realloc(ref_node->sorted_global, ref_node_max(ref_node), REF_GLOB);
    ref_realloc(ref_node->sorted_local, ref_node_max(ref_node), REF_INT);

    ref_realloc(ref_node->part, ref_node_max(ref_node), REF_INT);
    ref_realloc(ref_node->age, ref_node_max(ref_node), REF_INT);

    ref_realloc(ref_node->real,
                ((unsigned long)REF_NODE_REAL_PER *
                 (unsigned long)ref_node_max(ref_node)),
                REF_DBL);

    if (ref_node_naux(ref_node) > 0)
      ref_realloc(ref_node->aux,
                  ((unsigned long)ref_node_naux(ref_node) *
                   (unsigned long)ref_node_max(ref_node)),
                  REF_DBL);
  }

  *node = next2index(ref_node->blank);
  ref_node->blank = (REF_INT)ref_node->global[*node];

  ref_node->global[*node] = global;
  ref_node->part[*node] =
      ref_mpi_rank(ref_node_mpi(ref_node)); /*local default*/
  ref_node->age[*node] = 0;                 /* default new born */

  RSS(ref_node_metric_form(ref_node, *node, 1, 0, 0, 1, 0, 1), "set ident");

  (ref_node->n)++;
  return REF_SUCCESS;
}